

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::rollback
          (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *this)

{
  IStreamReader *pIVar1;
  reference pvVar2;
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *this_local;
  
  check_max(this);
  pIVar1 = this->reader_;
  pvVar2 = std::
           vector<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ::back(&this->stack_);
  IStreamReader::set_pos(pIVar1,*(undefined8 *)pvVar2,*(undefined8 *)&pvVar2->field_0x8);
  pvVar2 = std::
           vector<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ::back(&this->stack_);
  this->line_ = pvVar2->line_;
  std::
  vector<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
  ::pop_back(&this->stack_);
  return;
}

Assistant:

inline void rollback()
        {
            check_max();
            reader_.set_pos(stack_.back().pos_);
            line_ = stack_.back().line_;
            stack_.pop_back();
        }